

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O0

int __thiscall MeCab::Connector::open(Connector *this,char *__file,int __oflag,...)

{
  int iVar1;
  char *__file_00;
  undefined8 uVar2;
  char *in_stack_00000020;
  Param *in_stack_00000028;
  string filename;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  char *local_10;
  Connector *local_8;
  
  local_10 = __file;
  local_8 = this;
  Param::get<std::__cxx11::string>(in_stack_00000028,in_stack_00000020);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"matrix.bin",(allocator *)&stack0xffffffffffffff8f);
  create_filename(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  std::__cxx11::string::~string(local_50);
  __file_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = open(this,__file_00,0x169cac);
  uVar2 = std::__cxx11::string::~string(local_30);
  return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool Connector::open(const Param &param) {
  const std::string filename = create_filename
      (param.get<std::string>("dicdir"), MATRIX_FILE);
  return open(filename.c_str());
}